

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboRenderTest.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::FboCases::RecreateBuffersTest<256U>::render
          (RecreateBuffersTest<256U> *this,Context *ctx,Surface *dst)

{
  GLenum GVar1;
  byte bVar2;
  deUint32 program;
  int in_R9D;
  deUint32 depthbuf;
  float fStack_1cc;
  float local_1c8;
  Vec3 local_1c0;
  Framebuffer fbo;
  SingleTex2DShader texShader;
  
  SingleTex2DShader::SingleTex2DShader(&texShader);
  program = (*ctx->_vptr_Context[0x75])(ctx,&texShader);
  GVar1 = (this->super_FboRenderCase).m_config.stencilbufferType;
  createQuadsTex2D(ctx,2,0x1907,0x40,0x40,in_R9D);
  createMetaballsTex2D(ctx,1,0x1907,0x40,0x40,in_R9D);
  Functional::Framebuffer::Framebuffer
            (&fbo,ctx,&(this->super_FboRenderCase).m_config,0x80,0x80,0,0,0,0);
  Functional::Framebuffer::checkCompleteness(&fbo);
  SingleTex2DShader::setUnit(&texShader,ctx,program,0);
  (*ctx->_vptr_Context[9])(ctx,0x8d40,(ulong)fbo.m_framebuffer);
  (*ctx->_vptr_Context[5])(ctx,0,0,0x80,0x80);
  (*ctx->_vptr_Context[0x2a])(0x3f800000,0,0,0x3f800000,ctx);
  (*ctx->_vptr_Context[0x2d])(ctx,0x4500);
  (*ctx->_vptr_Context[0x33])(ctx,0xb71);
  (*ctx->_vptr_Context[6])(ctx,0xde1,2);
  depthbuf = 0xbf800000;
  fStack_1cc = -1.0;
  local_1c8 = 0.0;
  local_1c0.m_data[0] = 1.0;
  local_1c0.m_data[1] = 1.0;
  local_1c0.m_data[2] = 0.0;
  sglr::drawQuad(ctx,program,(Vec3 *)&depthbuf,&local_1c0);
  if (GVar1 != 0) {
    (*ctx->_vptr_Context[0x33])(ctx,0xc11);
    (*ctx->_vptr_Context[0x32])(ctx,0x20,0x20,0x40,0x40);
    (*ctx->_vptr_Context[0x2c])(ctx,1);
    (*ctx->_vptr_Context[0x2d])(ctx,0x400);
    (*ctx->_vptr_Context[0x34])(ctx,0xc11);
  }
  if (this->m_rebind == false) {
    (*ctx->_vptr_Context[9])(ctx,0x8d40,0);
  }
  _depthbuf = CONCAT44(fStack_1cc,fbo.m_depthbuffer);
  (*ctx->_vptr_Context[0xe])(ctx,1);
  (*ctx->_vptr_Context[0xc])(ctx,0x8d41,_depthbuf & 0xffffffff);
  (*ctx->_vptr_Context[0x23])(ctx,0x8d41,(ulong)fbo.m_config.depthbufferFormat,0x80,0x80);
  bVar2 = this->m_rebind;
  if ((bool)bVar2 == true) {
    (*ctx->_vptr_Context[0x20])(ctx,0x8d40,0x8d00,0x8d41,_depthbuf & 0xffffffff);
    bVar2 = this->m_rebind;
  }
  if ((bVar2 & 1) == 0) {
    (*ctx->_vptr_Context[9])(ctx,0x8d40,(ulong)fbo.m_framebuffer);
  }
  (*ctx->_vptr_Context[0x2a])(0,0,0x3f800000,0,ctx);
  (*ctx->_vptr_Context[0x2c])(ctx,0);
  (*ctx->_vptr_Context[0x2d])(ctx,0x100);
  if (GVar1 != 0) {
    (*ctx->_vptr_Context[0x33])(ctx,0xb90);
    (*ctx->_vptr_Context[0x35])(ctx,0x202,0,0xff);
  }
  (*ctx->_vptr_Context[6])(ctx,0xde1,1);
  depthbuf = 0xbf800000;
  fStack_1cc = -1.0;
  local_1c8 = 1.0;
  local_1c0.m_data[0] = 1.0;
  local_1c0.m_data[1] = 1.0;
  local_1c0.m_data[2] = -1.0;
  sglr::drawQuad(ctx,program,(Vec3 *)&depthbuf,&local_1c0);
  if (GVar1 != 0) {
    (*ctx->_vptr_Context[0x34])(ctx,0xb90);
  }
  (*ctx->_vptr_Context[0x34])(ctx,0xb71);
  (*ctx->_vptr_Context[0x80])(ctx,dst,0,0,0x80,0x80);
  Functional::Framebuffer::~Framebuffer(&fbo);
  sglr::ShaderProgram::~ShaderProgram(&texShader.super_ShaderProgram);
  return;
}

Assistant:

void RecreateBuffersTest<Buffers>::render (sglr::Context& ctx, Surface& dst)
{
	SingleTex2DShader	texShader;
	deUint32			texShaderID		= ctx.createProgram(&texShader);
	int					width			= 128;
	int					height			= 128;
	deUint32			metaballsTex	= 1;
	deUint32			quadsTex		= 2;
	bool				stencil			= getConfig().stencilbufferType != GL_NONE;

	createQuadsTex2D(ctx, quadsTex, GL_RGB, GL_UNSIGNED_BYTE, 64, 64);
	createMetaballsTex2D(ctx, metaballsTex, GL_RGB, GL_UNSIGNED_BYTE, 64, 64);

	Framebuffer fbo(ctx, getConfig(), width, height);
	fbo.checkCompleteness();

	// Setup shader
	texShader.setUnit(ctx, texShaderID, 0);

	// Draw scene
	ctx.bindFramebuffer(GL_FRAMEBUFFER, fbo.getFramebuffer());
	ctx.viewport(0, 0, width, height);
	ctx.clearColor(1.0f, 0.0f, 0.0f, 1.0f);
	ctx.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

	ctx.enable(GL_DEPTH_TEST);

	ctx.bindTexture(GL_TEXTURE_2D, quadsTex);
	sglr::drawQuad(ctx, texShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

	if (stencil)
	{
		ctx.enable(GL_SCISSOR_TEST);
		ctx.scissor(width/4, height/4, width/2, height/2);
		ctx.clearStencil(1);
		ctx.clear(GL_STENCIL_BUFFER_BIT);
		ctx.disable(GL_SCISSOR_TEST);
	}

	// Recreate buffers
	if (!m_rebind)
		ctx.bindFramebuffer(GL_FRAMEBUFFER, 0);

	if (Buffers & GL_COLOR_BUFFER_BIT)
	{
		deUint32 colorbuf = fbo.getColorbuffer();
		switch (fbo.getConfig().colorbufferType)
		{
			case GL_TEXTURE_2D:
				ctx.deleteTextures(1, &colorbuf);
				ctx.bindTexture(GL_TEXTURE_2D, colorbuf);
				ctx.texImage2D(GL_TEXTURE_2D, 0, fbo.getConfig().colorbufferFormat, width, height);
				ctx.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);

				if (m_rebind)
					ctx.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, colorbuf, 0);
				break;

			case GL_RENDERBUFFER:
				ctx.deleteRenderbuffers(1, &colorbuf);
				ctx.bindRenderbuffer(GL_RENDERBUFFER, colorbuf);
				ctx.renderbufferStorage(GL_RENDERBUFFER, fbo.getConfig().colorbufferFormat, width, height);

				if (m_rebind)
					ctx.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, colorbuf);
				break;

			default:
				DE_ASSERT(false);
		}
	}

	if (Buffers & GL_DEPTH_BUFFER_BIT)
	{
		deUint32 depthbuf = fbo.getDepthbuffer();
		DE_ASSERT(fbo.getConfig().depthbufferType == GL_RENDERBUFFER);

		ctx.deleteRenderbuffers(1, &depthbuf);
		ctx.bindRenderbuffer(GL_RENDERBUFFER, depthbuf);
		ctx.renderbufferStorage(GL_RENDERBUFFER, fbo.getConfig().depthbufferFormat, width, height);

		if (m_rebind)
			ctx.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, depthbuf);
	}

	if (Buffers & GL_STENCIL_BUFFER_BIT)
	{
		deUint32 stencilbuf = fbo.getStencilbuffer();
		DE_ASSERT(fbo.getConfig().stencilbufferType == GL_RENDERBUFFER);

		ctx.deleteRenderbuffers(1, &stencilbuf);
		ctx.bindRenderbuffer(GL_RENDERBUFFER, stencilbuf);
		ctx.renderbufferStorage(GL_RENDERBUFFER, fbo.getConfig().stencilbufferFormat, width, height);

		if (m_rebind)
			ctx.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_RENDERBUFFER, stencilbuf);
	}

	if (!m_rebind)
		ctx.bindFramebuffer(GL_FRAMEBUFFER, fbo.getFramebuffer());

	ctx.clearColor(0.0f, 0.0f, 1.0f, 0.0f);
	ctx.clearStencil(0);
	ctx.clear(Buffers); // \note Clear only buffers that were re-created

	if (stencil)
	{
		// \note Stencil test enabled only if we have stencil buffer
		ctx.enable(GL_STENCIL_TEST);
		ctx.stencilFunc(GL_EQUAL, 0, 0xffu);
	}
	ctx.bindTexture(GL_TEXTURE_2D, metaballsTex);
	sglr::drawQuad(ctx, texShaderID, Vec3(-1.0f, -1.0f, 1.0f), Vec3(1.0f, 1.0f, -1.0f));
	if (stencil)
		ctx.disable(GL_STENCIL_TEST);

	ctx.disable(GL_DEPTH_TEST);

	// Read from fbo
	ctx.readPixels(dst, 0, 0, width, height);
}